

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O0

FDynamicColormap * GetSpecialLights(PalEntry color,PalEntry fade,int desaturate)

{
  uint32 uVar1;
  uint32 uVar2;
  uint uVar3;
  FDynamicColormap *this;
  BYTE *pBVar4;
  FDynamicColormap *local_28;
  FDynamicColormap *colormap;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_18;
  int desaturate_local;
  PalEntry fade_local;
  PalEntry color_local;
  
  local_28 = &NormalLight;
  local_18 = fade.field_0;
  desaturate_local = (int)color.field_0;
  do {
    if (local_28 == (FDynamicColormap *)0x0) {
      this = (FDynamicColormap *)operator_new(0x20);
      FDynamicColormap::FDynamicColormap(this);
      this->Next = NormalLight.Next;
      (this->Color).field_0.d = desaturate_local;
      (this->Fade).field_0.field_0 =
           (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)local_18;
      this->Desaturate = desaturate;
      NormalLight.Next = this;
      uVar3 = (*Renderer->_vptr_FRenderer[2])();
      if ((uVar3 & 1) == 0) {
        this->Maps = (BYTE *)0x0;
      }
      else {
        pBVar4 = (BYTE *)operator_new__(0x2000);
        this->Maps = pBVar4;
        FDynamicColormap::BuildLights(this);
      }
      return this;
    }
    uVar1 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&desaturate_local);
    uVar2 = PalEntry::operator_cast_to_unsigned_int(&local_28->Color);
    if (uVar1 == uVar2) {
      uVar1 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&local_18.field_0);
      uVar2 = PalEntry::operator_cast_to_unsigned_int(&local_28->Fade);
      if ((uVar1 == uVar2) && (desaturate == local_28->Desaturate)) {
        return local_28;
      }
    }
    local_28 = local_28->Next;
  } while( true );
}

Assistant:

FDynamicColormap *GetSpecialLights (PalEntry color, PalEntry fade, int desaturate)
{
	FDynamicColormap *colormap;

	// If this colormap has already been created, just return it
	for (colormap = &NormalLight; colormap != NULL; colormap = colormap->Next)
	{
		if (color == colormap->Color &&
			fade == colormap->Fade &&
			desaturate == colormap->Desaturate)
		{
			return colormap;
		}
	}

	// Not found. Create it.
	colormap = new FDynamicColormap;
	colormap->Next = NormalLight.Next;
	colormap->Color = color;
	colormap->Fade = fade;
	colormap->Desaturate = desaturate;
	NormalLight.Next = colormap;

	if (Renderer->UsesColormap())
	{
		colormap->Maps = new BYTE[NUMCOLORMAPS*256];
		colormap->BuildLights ();
	}
	else colormap->Maps = NULL;

	return colormap;
}